

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm::SmallVectorImpl<llvm::SMFixIt>::append<llvm::SMFixIt_const*,void>
          (SmallVectorImpl<llvm::SMFixIt> *this,SMFixIt *in_start,SMFixIt *in_end)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = ((long)in_end - (long)in_start) / 0x30;
  uVar2 = (ulong)(this->super_SmallVectorTemplateBase<llvm::SMFixIt,_false>).
                 super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.Size;
  if ((this->super_SmallVectorTemplateBase<llvm::SMFixIt,_false>).
      super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.Capacity - uVar2 <
      uVar1) {
    SmallVectorTemplateBase<llvm::SMFixIt,_false>::grow
              (&this->super_SmallVectorTemplateBase<llvm::SMFixIt,_false>,uVar2 + uVar1);
    uVar2 = (ulong)(this->super_SmallVectorTemplateBase<llvm::SMFixIt,_false>).
                   super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.Size;
  }
  std::__uninitialized_copy<false>::__uninit_copy<llvm::SMFixIt_const*,llvm::SMFixIt*>
            (in_start,in_end,
             (SMFixIt *)
             (uVar2 * 0x30 +
             (long)(this->super_SmallVectorTemplateBase<llvm::SMFixIt,_false>).
                   super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.BeginX
             ));
  SmallVectorBase::set_size
            ((SmallVectorBase *)this,
             uVar1 + (this->super_SmallVectorTemplateBase<llvm::SMFixIt,_false>).
                     super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.Size
            );
  return;
}

Assistant:

void append(in_iter in_start, in_iter in_end) {
    size_type NumInputs = std::distance(in_start, in_end);
    // Grow allocated space if needed.
    if (NumInputs > this->capacity() - this->size())
      this->grow(this->size()+NumInputs);

    // Copy the new elements over.
    this->uninitialized_copy(in_start, in_end, this->end());
    this->set_size(this->size() + NumInputs);
  }